

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
HTTPRequest::GetHeader
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,HTTPRequest *this,string *hdr)

{
  long lVar1;
  long in_FS_OFFSET;
  pair<bool,_const_char_*> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = evhttp_request_get_input_headers(this->req);
  if (lVar1 == 0) {
    __assert_fail("headers",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                  ,0x25c,
                  "std::pair<bool, std::string> HTTPRequest::GetHeader(const std::string &) const");
  }
  local_28.second = (char *)evhttp_find_header(lVar1,(hdr->_M_dataplus)._M_p);
  local_28.first = local_28.second == (char *)0x0;
  if (local_28.first) {
    local_28.second = "";
  }
  local_28.first = !local_28.first;
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bool,_const_char_*,_true>(__return_storage_ptr__,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> HTTPRequest::GetHeader(const std::string& hdr) const
{
    const struct evkeyvalq* headers = evhttp_request_get_input_headers(req);
    assert(headers);
    const char* val = evhttp_find_header(headers, hdr.c_str());
    if (val)
        return std::make_pair(true, val);
    else
        return std::make_pair(false, "");
}